

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClearIniSettings(void)

{
  ImGuiContext *pIVar1;
  ImGuiSettingsHandler *handler;
  ImGuiSettingsHandler *pIVar2;
  long lVar3;
  
  pIVar1 = GImGui;
  ImVector<char>::clear(&(GImGui->SettingsIniData).Buf);
  pIVar2 = (pIVar1->SettingsHandlers).Data;
  for (lVar3 = (long)(pIVar1->SettingsHandlers).Size * 0x48; lVar3 != 0; lVar3 = lVar3 + -0x48) {
    if (pIVar2->ClearAllFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
      (*pIVar2->ClearAllFn)(pIVar1,pIVar2);
    }
    pIVar2 = pIVar2 + 1;
  }
  return;
}

Assistant:

void ImGui::ClearIniSettings()
{
    ImGuiContext& g = *GImGui;
    g.SettingsIniData.clear();
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        if (handler.ClearAllFn != NULL)
            handler.ClearAllFn(&g, &handler);
}